

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O0

Gia_Man_t * Gia_ManUnrollAndCofactor(Gia_Man_t *p,int nFrames,int nFanMax,int fVerbose)

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *pNew_00;
  Vec_Int_t *vSigs;
  Vec_Int_t *vSigs_00;
  Gia_Man_t *pNew;
  Gia_Man_t *pFrames;
  Gia_Man_t *pAig;
  Vec_Int_t *vTemp;
  Vec_Int_t *vCofSigs;
  int fVerbose_local;
  int nFanMax_local;
  int nFrames_local;
  Gia_Man_t *p_local;
  
  pGVar1 = Gia_ManUnrollInit(p,nFrames);
  pNew_00 = Gia_ManCleanup(pGVar1);
  vSigs = Gia_ManDetectSeqSignalsWithFanout(p,nFanMax,fVerbose);
  vSigs_00 = Gia_ManTransferFrames(p,pGVar1,nFrames,pNew_00,vSigs);
  Vec_IntFree(vSigs);
  Gia_ManStop(pGVar1);
  Vec_IntErase(&p->vCopies);
  pGVar1 = Gia_ManDupCofAllInt(pNew_00,vSigs_00,fVerbose);
  Vec_IntFree(vSigs_00);
  Gia_ManStop(pNew_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManUnrollAndCofactor( Gia_Man_t * p, int nFrames, int nFanMax, int fVerbose )
{
    Vec_Int_t * vCofSigs, * vTemp;
    Gia_Man_t * pAig, * pFrames, * pNew;
    // compute initialized timeframes
    pFrames  = Gia_ManUnrollInit( p, nFrames );
    pAig     = Gia_ManCleanup( pFrames );
    // compute and remap set/reset/enable signals
    vCofSigs = Gia_ManDetectSeqSignalsWithFanout( p, nFanMax, fVerbose );
    vCofSigs = Gia_ManTransferFrames( p, pFrames, nFrames, pAig, vTemp = vCofSigs );
    Vec_IntFree( vTemp );
    Gia_ManStop( pFrames );
    Vec_IntErase( &p->vCopies );
    // cofactor all these variables
    pNew = Gia_ManDupCofAllInt( pAig, vCofSigs, fVerbose );
    Vec_IntFree( vCofSigs );
    Gia_ManStop( pAig );
    return pNew;
}